

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btUniformScalingShape.cpp
# Opt level: O0

void __thiscall
btUniformScalingShape::getAabbSlow
          (btUniformScalingShape *this,btTransform *t,btVector3 *aabbMin,btVector3 *aabbMax)

{
  btScalar *pbVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  btTransform *in_RSI;
  long *in_RDI;
  btVector3 bVar2;
  btVector3 marginVec;
  int i_1;
  btVector3 aabbMax1;
  btVector3 aabbMin1;
  int i;
  btVector3 _supporting [6];
  btVector3 _directions [6];
  btScalar in_stack_fffffffffffffdb8;
  btScalar in_stack_fffffffffffffdbc;
  btVector3 *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  btScalar local_20c;
  btScalar local_208;
  btScalar local_204;
  btVector3 local_200;
  btVector3 local_1f0;
  btVector3 local_1e0;
  int local_1d0;
  btScalar local_1cc;
  btScalar local_1c8;
  btScalar local_1c4;
  btVector3 local_1c0;
  btScalar local_1b0;
  btScalar local_1ac;
  btScalar local_1a8;
  btVector3 local_1a4;
  undefined8 local_194;
  undefined8 local_18c;
  int local_184;
  btScalar local_180;
  btScalar local_17c;
  btScalar local_178;
  btScalar local_174;
  btScalar local_170;
  btScalar local_16c;
  btScalar local_168;
  btScalar local_164;
  btScalar local_160;
  btScalar local_15c;
  btScalar local_158;
  btScalar local_154;
  btScalar local_150;
  btScalar local_14c;
  btScalar local_148;
  btScalar local_144;
  btScalar local_140;
  btScalar local_13c;
  btVector3 local_138;
  btVector3 bStack_128;
  btVector3 bStack_118;
  btVector3 bStack_108;
  btVector3 bStack_f8;
  btVector3 bStack_e8;
  btScalar local_d0;
  btScalar local_cc;
  btScalar local_c8;
  btScalar local_c4;
  btScalar local_c0;
  btScalar local_bc;
  btScalar local_b8;
  btScalar local_b4;
  btScalar local_b0;
  btScalar local_ac;
  btScalar local_a8;
  btScalar local_a4;
  btScalar local_a0;
  btScalar local_9c;
  btScalar local_98;
  btScalar local_94;
  btScalar local_90;
  btScalar local_8c;
  btVector3 local_88 [4];
  btVector3 bStack_48;
  btVector3 bStack_38;
  undefined8 *local_20;
  undefined8 *local_18;
  btTransform *local_10;
  
  local_8c = 1.0;
  local_90 = 0.0;
  local_94 = 0.0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  btVector3::btVector3(local_88,&local_8c,&local_90,&local_94);
  local_98 = 0.0;
  local_9c = 1.0;
  local_a0 = 0.0;
  btVector3::btVector3(local_88 + 1,&local_98,&local_9c,&local_a0);
  local_a4 = 0.0;
  local_a8 = 0.0;
  local_ac = 1.0;
  btVector3::btVector3(local_88 + 2,&local_a4,&local_a8,&local_ac);
  local_b0 = -1.0;
  local_b4 = 0.0;
  local_b8 = 0.0;
  btVector3::btVector3(local_88 + 3,&local_b0,&local_b4,&local_b8);
  local_bc = 0.0;
  local_c0 = -1.0;
  local_c4 = 0.0;
  btVector3::btVector3(&bStack_48,&local_bc,&local_c0,&local_c4);
  local_c8 = 0.0;
  local_cc = 0.0;
  local_d0 = -1.0;
  btVector3::btVector3(&bStack_38,&local_c8,&local_cc,&local_d0);
  local_13c = 0.0;
  local_140 = 0.0;
  local_144 = 0.0;
  btVector3::btVector3(&local_138,&local_13c,&local_140,&local_144);
  local_148 = 0.0;
  local_14c = 0.0;
  local_150 = 0.0;
  btVector3::btVector3(&bStack_128,&local_148,&local_14c,&local_150);
  local_154 = 0.0;
  local_158 = 0.0;
  local_15c = 0.0;
  btVector3::btVector3(&bStack_118,&local_154,&local_158,&local_15c);
  local_160 = 0.0;
  local_164 = 0.0;
  local_168 = 0.0;
  btVector3::btVector3(&bStack_108,&local_160,&local_164,&local_168);
  local_16c = 0.0;
  local_170 = 0.0;
  local_174 = 0.0;
  btVector3::btVector3(&bStack_f8,&local_16c,&local_170,&local_174);
  local_178 = 0.0;
  local_17c = 0.0;
  local_180 = 0.0;
  btVector3::btVector3(&bStack_e8,&local_178,&local_17c,&local_180);
  for (local_184 = 0; local_184 < 6; local_184 = local_184 + 1) {
    in_stack_fffffffffffffdc0 = local_88 + local_184;
    btTransform::getBasis(local_10);
    bVar2 = ::operator*(in_stack_fffffffffffffdc0,
                        (btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8)
                       );
    local_18c = bVar2.m_floats._8_8_;
    local_194 = bVar2.m_floats._0_8_;
    *(undefined8 *)local_88[local_184].m_floats = local_194;
    *(undefined8 *)(local_88[local_184].m_floats + 2) = local_18c;
  }
  (**(code **)(*in_RDI + 0x98))(in_RDI,local_88,&local_138,6);
  local_1a8 = 0.0;
  local_1ac = 0.0;
  local_1b0 = 0.0;
  btVector3::btVector3(&local_1a4,&local_1a8,&local_1ac,&local_1b0);
  local_1c4 = 0.0;
  local_1c8 = 0.0;
  local_1cc = 0.0;
  btVector3::btVector3(&local_1c0,&local_1c4,&local_1c8,&local_1cc);
  for (local_1d0 = 0; local_1d0 < 3; local_1d0 = local_1d0 + 1) {
    bVar2 = btTransform::operator()
                      ((btTransform *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                       (btVector3 *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    local_1e0.m_floats._8_8_ = bVar2.m_floats._8_8_;
    local_1e0.m_floats._0_8_ = bVar2.m_floats._0_8_;
    pbVar1 = btVector3::operator_cast_to_float_(&local_1e0);
    in_stack_fffffffffffffdb8 = pbVar1[local_1d0];
    pbVar1 = btVector3::operator_cast_to_float_(&local_1c0);
    pbVar1[local_1d0] = in_stack_fffffffffffffdb8;
    bVar2 = btTransform::operator()
                      ((btTransform *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                       (btVector3 *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    local_1f0.m_floats._8_8_ = bVar2.m_floats._8_8_;
    local_1f0.m_floats._0_8_ = bVar2.m_floats._0_8_;
    pbVar1 = btVector3::operator_cast_to_float_(&local_1f0);
    in_stack_fffffffffffffdbc = pbVar1[local_1d0];
    pbVar1 = btVector3::operator_cast_to_float_(&local_1a4);
    pbVar1[local_1d0] = in_stack_fffffffffffffdbc;
  }
  local_204 = (btScalar)(**(code **)(*in_RDI + 0x60))();
  local_208 = (btScalar)(**(code **)(*in_RDI + 0x60))();
  local_20c = (btScalar)(**(code **)(*in_RDI + 0x60))();
  btVector3::btVector3(&local_200,&local_204,&local_208,&local_20c);
  bVar2 = operator-(in_stack_fffffffffffffdc0,
                    (btVector3 *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  *local_18 = bVar2.m_floats._0_8_;
  local_18[1] = bVar2.m_floats._8_8_;
  bVar2 = operator+(in_stack_fffffffffffffdc0,
                    (btVector3 *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  *local_20 = bVar2.m_floats._0_8_;
  local_20[1] = bVar2.m_floats._8_8_;
  return;
}

Assistant:

void btUniformScalingShape::getAabbSlow(const btTransform& t,btVector3& aabbMin,btVector3& aabbMax) const
{
#if 1
	btVector3 _directions[] =
	{
		btVector3( 1.,  0.,  0.),
		btVector3( 0.,  1.,  0.),
		btVector3( 0.,  0.,  1.),
		btVector3( -1., 0.,  0.),
		btVector3( 0., -1.,  0.),
		btVector3( 0.,  0., -1.)
	};
	
	btVector3 _supporting[] =
	{
		btVector3( 0., 0., 0.),
		btVector3( 0., 0., 0.),
		btVector3( 0., 0., 0.),
		btVector3( 0., 0., 0.),
		btVector3( 0., 0., 0.),
		btVector3( 0., 0., 0.)
	};

	for (int i=0;i<6;i++)
	{
		_directions[i] = _directions[i]*t.getBasis();
	}
	
	batchedUnitVectorGetSupportingVertexWithoutMargin(_directions, _supporting, 6);
	
	btVector3 aabbMin1(0,0,0),aabbMax1(0,0,0);

	for ( int i = 0; i < 3; ++i )
	{
		aabbMax1[i] = t(_supporting[i])[i];
		aabbMin1[i] = t(_supporting[i + 3])[i];
	}
	btVector3 marginVec(getMargin(),getMargin(),getMargin());
	aabbMin = aabbMin1-marginVec;
	aabbMax = aabbMax1+marginVec;
	
#else

	btScalar margin = getMargin();
	for (int i=0;i<3;i++)
	{
		btVector3 vec(btScalar(0.),btScalar(0.),btScalar(0.));
		vec[i] = btScalar(1.);
		btVector3 sv = localGetSupportingVertex(vec*t.getBasis());
		btVector3 tmp = t(sv);
		aabbMax[i] = tmp[i]+margin;
		vec[i] = btScalar(-1.);
		sv = localGetSupportingVertex(vec*t.getBasis());
		tmp = t(sv);
		aabbMin[i] = tmp[i]-margin;
	}

#endif
}